

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

int __thiscall QTabBarPrivate::selectNewCurrentIndexFrom(QTabBarPrivate *this,int fromIndex)

{
  Tab **ppTVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  ppTVar1 = (this->tabList).d.ptr;
  uVar2 = (this->tabList).d.size;
  uVar5 = (ulong)fromIndex;
  iVar3 = -1;
  do {
    if ((long)uVar2 <= (long)uVar5) {
LAB_0044f7d6:
      do {
        uVar4 = fromIndex;
        if ((int)uVar4 < 1) {
          return iVar3;
        }
        fromIndex = uVar4 - 1;
      } while ((uVar2 <= (uint)fromIndex) || ((~ppTVar1[(uint)fromIndex]->field_0xe4 & 3) != 0));
      return uVar4 - 1;
    }
    if ((uVar5 < uVar2) && ((~ppTVar1[uVar5]->field_0xe4 & 3) == 0)) {
      iVar3 = (int)uVar5;
      if (-1 < (long)uVar5) {
        return iVar3;
      }
      goto LAB_0044f7d6;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int QTabBarPrivate::selectNewCurrentIndexFrom(int fromIndex)
{
    int newindex = -1;
    for (int i = fromIndex; i < tabList.size(); ++i) {
        if (at(i)->visible && at(i)->enabled) {
          newindex = i;
          break;
        }
    }
    if (newindex < 0) {
        for (int i = fromIndex-1; i > -1; --i) {
            if (at(i)->visible && at(i)->enabled) {
              newindex = i;
              break;
            }
        }
    }

    return newindex;
}